

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.h
# Opt level: O2

_Bool hex_encode(void *buf,size_t bufsize,char *dest,size_t destsize)

{
  size_t sVar1;
  byte bVar2;
  char cVar3;
  
  if (bufsize * 2 < destsize) {
    for (sVar1 = 0; bufsize != sVar1; sVar1 = sVar1 + 1) {
      bVar2 = *(byte *)((long)buf + sVar1);
      cVar3 = (bVar2 >> 4) + 0x57;
      if (bVar2 < 0xa0) {
        cVar3 = (bVar2 >> 4) + 0x30;
      }
      dest[sVar1 * 2] = cVar3;
      bVar2 = bVar2 & 0xf;
      cVar3 = bVar2 + 0x57;
      if (bVar2 < 10) {
        cVar3 = bVar2 + 0x30;
      }
      dest[sVar1 * 2 + 1] = cVar3;
    }
    dest[sVar1 * 2] = '\0';
  }
  return bufsize * 2 < destsize;
}

Assistant:

static inline size_t hex_str_size(size_t bytes)
{
	return 2 * bytes + 1;
}